

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O2

int mbedtls_ecdhopt_shared_secret
              (mbedtls_ecdhopt_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  
  if (ctx->curve == MBEDTLS_ECP_DP_CURVE25519) {
    *olen = 0x20;
    iVar2 = -0x4f00;
    if (0x1f < blen) {
      Hacl_Curve25519_crypto_scalarmult(buf,(uint8_t *)&ctx->ctx,(ctx->ctx).x25519.peer_point);
      *(undefined8 *)((long)&ctx->ctx + 0x10) = 0;
      *(undefined8 *)((long)&ctx->ctx + 0x18) = 0;
      *(undefined8 *)&ctx->ctx = 0;
      *(undefined8 *)((long)&ctx->ctx + 8) = 0;
      iVar1 = bcmp(buf,&ctx->ctx,0x20);
      iVar2 = -0x4d00;
      if (iVar1 != 0) {
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  iVar2 = mbedtls_ecdh_calc_secret(&(ctx->ctx).ec,olen,buf,blen,f_rng,p_rng);
  return iVar2;
}

Assistant:

int mbedtls_ecdhopt_shared_secret( mbedtls_ecdhopt_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    if( ctx->curve == MBEDTLS_ECP_DP_CURVE25519 )
    {
        *olen = 32;

        if( blen < *olen )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

        Hacl_Curve25519_crypto_scalarmult( buf, ctx->ctx.x25519.our_secret,
            ctx->ctx.x25519.peer_point);

        // Wipe the DH secret and don't let the peer chose a small subgroup point
        memset( ctx->ctx.x25519.our_secret, 0, 32 );
        if( memcmp( buf, ctx->ctx.x25519.our_secret, 32) == 0 )
            return MBEDTLS_ERR_ECP_RANDOM_FAILED;

        return( 0 );
    }
    else
    {
        return mbedtls_ecdh_calc_secret( &ctx->ctx.ec, olen, buf, blen, f_rng, p_rng );
    }
}